

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall Js::InterpreterStackFrame::GetRootObject(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x44) & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2173,"(!this->GetFunctionBody()->IsJsBuiltInCode())",
                                "!this->GetFunctionBody()->IsJsBuiltInCode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ValidateRegValue(this,*(Var *)(this + 0x168),false,true);
}

Assistant:

Var InterpreterStackFrame::GetRootObject() const
    {
        Assert(!this->GetFunctionBody()->IsJsBuiltInCode());
        Var rootObject = GetReg(Js::FunctionBody::RootObjectRegSlot);
        Assert(rootObject == this->GetFunctionBody()->LoadRootObject());
        return rootObject;
    }